

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableAnalyzerSubprocess.cpp
# Opt level: O2

void __thiscall EnrichableAnalyzerSubprocess::Start(EnrichableAnalyzerSubprocess *this)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  wordexp_t cmdParsed;
  char *args [25];
  
  if ((this->parserCommand)._M_string_length == 0) {
    std::operator<<((ostream *)&std::cerr,"No parser command defined; aborting subprocess.\n");
    Terminate(this);
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Starting analyzer subprocess: ");
    std::operator<<((ostream *)&std::cerr,(string *)&this->parserCommand);
    std::operator<<((ostream *)&std::cerr,"\n");
  }
  iVar2 = pipe(this->inpipefd);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to create input pipe: ");
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
    std::operator<<((ostream *)&std::cerr,"\n");
    Terminate(this);
  }
  iVar2 = pipe(this->outpipefd);
  if (iVar2 < 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to create output pipe: ");
    piVar4 = __errno_location();
    std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
    std::operator<<((ostream *)&std::cerr,"\n");
    Terminate(this);
  }
  std::operator<<((ostream *)&std::cerr,"Starting fork...\n");
  _Var3 = fork();
  this->commandPid = _Var3;
  if (_Var3 != 0) {
    close(this->inpipefd[1]);
    close(this->outpipefd[0]);
LAB_0010d13d:
    bVar1 = GetFeatureEnablement(this,"bubble");
    this->featureBubble = bVar1;
    bVar1 = GetFeatureEnablement(this,"marker");
    this->featureMarker = bVar1;
    bVar1 = GetFeatureEnablement(this,"tabular");
    this->featureTabular = bVar1;
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Forked...\n");
  iVar2 = dup2(this->outpipefd[0],0);
  if (iVar2 < 0) {
    pcVar5 = "Failed to redirect STDIN: ";
  }
  else {
    iVar2 = dup2(this->inpipefd[1],1);
    if (-1 < iVar2) {
      wordexp((this->parserCommand)._M_dataplus._M_p,(wordexp_t *)&cmdParsed,0);
      for (sVar6 = 0; cmdParsed.we_wordc != sVar6; sVar6 = sVar6 + 1) {
        args[sVar6] = cmdParsed.we_wordv[sVar6];
      }
      args[cmdParsed.we_wordc] = (char *)0x0;
      close(this->inpipefd[0]);
      close(this->inpipefd[1]);
      close(this->outpipefd[0]);
      close(this->outpipefd[1]);
      execvp(args[0],args);
      std::operator<<((ostream *)&std::cerr,"Failed to spawn analyzer subprocess!\n");
      goto LAB_0010d13d;
    }
    pcVar5 = "Failed to redirect STDOUT: ";
  }
  std::operator<<((ostream *)&std::cerr,pcVar5);
  piVar4 = __errno_location();
  std::ostream::operator<<((ostream *)&std::cerr,*piVar4);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(*piVar4);
}

Assistant:

void EnrichableAnalyzerSubprocess::Start() {
	if(!parserCommand.length()) {
		std::cerr << "No parser command defined; aborting subprocess.\n";
		Terminate();
	} else {
		std::cerr << "Starting analyzer subprocess: ";
		std::cerr << parserCommand;
		std::cerr << "\n";
	}


	if(pipe(inpipefd) < 0) {
		std::cerr << "Failed to create input pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	if(pipe(outpipefd) < 0) {
		std::cerr << "Failed to create output pipe: ";
		std::cerr << errno;
		std::cerr << "\n";
		Terminate();
	}
	std::cerr << "Starting fork...\n";
	commandPid = fork();

	if(commandPid == 0) {
		std::cerr << "Forked...\n";
		if(dup2(outpipefd[0], STDIN_FILENO) < 0) {
			std::cerr << "Failed to redirect STDIN: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}
		if(dup2(inpipefd[1], STDOUT_FILENO) < 0) {
			std::cerr << "Failed to redirect STDOUT: ";
			std::cerr << errno;
			std::cerr << "\n";
			exit(errno);
		}

		wordexp_t cmdParsed;
		char *args[25];

		wordexp(parserCommand.c_str(), &cmdParsed, 0);
		int i;
		for(i = 0; i < cmdParsed.we_wordc; i++) {
			args[i] = cmdParsed.we_wordv[i];
		}
		args[i] = (char*)NULL;

		close(inpipefd[0]);
		close(inpipefd[1]);
		close(outpipefd[0]);
		close(outpipefd[1]);

		execvp(args[0], args);

		std::cerr << "Failed to spawn analyzer subprocess!\n";
	} else {
		close(inpipefd[1]);
		close(outpipefd[0]);
	}

	// Check script to see which features are enabled;
	// * 'no': This feature can be skipped.  This is used to improve
	//   performance by allowing the script to not receive messages for
	//   features it does not support.
	// * 'yes': Send messages of this type.
	// * Anything else: Send messages of this type.  This might be surprising,
	//   but it's more important to me that the default case be simple
	//   than the default case be high-performance.   Scripts are expected
	//   to respond to even unhandled messages.
	featureBubble = GetFeatureEnablement(BUBBLE_PREFIX);
	featureMarker = GetFeatureEnablement(MARKER_PREFIX);
	featureTabular = GetFeatureEnablement(TABULAR_PREFIX);
}